

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yy_expression(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = G->pos;
  iVar2 = G->thunkpos;
  iVar1 = yy_sequence(G);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    while( true ) {
      iVar3 = G->pos;
      iVar2 = G->thunkpos;
      iVar1 = yymatchChar(G,0x7c);
      if (iVar1 == 0) break;
      yy__(G);
      iVar1 = yy_sequence(G);
      if (iVar1 == 0) break;
      yyDo(G,yy_1_expression,G->begin,G->end,"yy_1_expression");
    }
    iVar1 = 1;
  }
  G->pos = iVar3;
  G->thunkpos = iVar2;
  return iVar1;
}

Assistant:

YY_RULE(int) yy_expression(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "expression"));
  if (!yy_sequence(G))  goto l91;

  l92:;	
  {  int yypos93= G->pos, yythunkpos93= G->thunkpos;  if (!yy_BAR(G))  goto l93;
  if (!yy_sequence(G))  goto l93;
  yyDo(G, yy_1_expression, G->begin, G->end, "yy_1_expression");
  goto l92;
  l93:;	  G->pos= yypos93; G->thunkpos= yythunkpos93;
  }  yyprintf((stderr, "  ok   expression"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l91:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "expression"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}